

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Printer::PrintField
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,
          TextGenerator *generator)

{
  _Base_ptr p_Var1;
  bool bVar2;
  Type TVar3;
  uint uVar4;
  int iVar5;
  _Rb_tree_header *p_Var6;
  Message *message_00;
  undefined4 extraout_var_00;
  _Rb_tree_header *p_Var7;
  Reflection *reflection_00;
  ulong uVar8;
  char *text;
  FieldValuePrinter *pFVar9;
  ulong uVar10;
  pointer local_88;
  pointer local_80;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  local_78;
  Reflection *local_58;
  Message *local_50;
  _Rb_tree_header *local_48;
  string *local_40;
  ulong local_38;
  undefined4 extraout_var;
  
  local_58 = reflection;
  if ((((this->use_short_repeated_primitives_ == true) && (*(int *)(field + 0x4c) == 3)) &&
      (TVar3 = FieldDescriptor::type(field),
      *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar3 * 4) != 9)) &&
     (TVar3 = FieldDescriptor::type(field),
     *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar3 * 4) != 10)) {
    PrintShortRepeatedField(this,message,local_58,field,generator);
    return;
  }
  reflection_00 = local_58;
  if (*(int *)(field + 0x4c) == 3) {
    uVar4 = (*local_58->_vptr_Reflection[6])();
  }
  else {
    uVar4 = (*local_58->_vptr_Reflection[5])(local_58,message,field);
    uVar4 = uVar4 & 0xff;
  }
  bVar2 = FieldDescriptor::is_map(field);
  if (bVar2) {
    DynamicMapSorter::Sort(&local_78,message,uVar4,reflection_00,field);
    local_88 = local_78.
               super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_80 = local_78.
               super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    local_80 = (pointer)0x0;
    local_88 = (pointer)0x0;
  }
  if (0 < (int)uVar4) {
    local_48 = &(this->custom_printers_)._M_t._M_impl.super__Rb_tree_header;
    local_40 = &generator->indent_;
    local_38 = (ulong)uVar4;
    uVar10 = 0;
    local_50 = message;
    do {
      uVar8 = 0xffffffff;
      if (*(int *)(field + 0x4c) == 3) {
        uVar8 = uVar10 & 0xffffffff;
      }
      PrintFieldName(this,message,reflection_00,field,generator);
      TVar3 = FieldDescriptor::type(field);
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar3 * 4) == 10) {
        p_Var6 = local_48;
        for (p_Var1 = (this->custom_printers_)._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_parent; (_Rb_tree_header *)p_Var1 != (_Rb_tree_header *)0x0;
            p_Var1 = (&p_Var1->_M_left)[*(FieldDescriptor **)(p_Var1 + 1) < field]) {
          if (*(FieldDescriptor **)(p_Var1 + 1) >= field) {
            p_Var6 = (_Rb_tree_header *)p_Var1;
          }
        }
        p_Var7 = local_48;
        if ((p_Var6 != local_48) &&
           (p_Var7 = p_Var6, field < (FieldDescriptor *)p_Var6->_M_node_count)) {
          p_Var7 = local_48;
        }
        if (p_Var7 == local_48) {
          pFVar9 = (this->default_field_value_printer_).ptr_;
        }
        else {
          pFVar9 = *(FieldValuePrinter **)(p_Var7 + 1);
        }
        if (*(int *)(field + 0x4c) == 3) {
          if (bVar2) {
            message_00 = local_88[uVar10];
          }
          else {
            iVar5 = (*reflection_00->_vptr_Reflection[0x34])
                              (reflection_00,local_50,field,uVar10 & 0xffffffff);
            message_00 = (Message *)CONCAT44(extraout_var_00,iVar5);
          }
        }
        else {
          iVar5 = (*reflection_00->_vptr_Reflection[0x1b])(reflection_00,local_50,field,0);
          message_00 = (Message *)CONCAT44(extraout_var,iVar5);
        }
        (*pFVar9->_vptr_FieldValuePrinter[0xd])
                  (&local_78,pFVar9,message_00,uVar8,(ulong)uVar4,(ulong)this->single_line_mode_);
        TextGenerator::Print
                  (generator,
                   (char *)local_78.
                           super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                   (size_t)local_78.
                           super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
        if (local_78.
            super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&local_78.
                      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_78.
                          super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_78.
                                super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        std::__cxx11::string::append((char *)local_40);
        Print(this,message_00,generator);
        TextGenerator::Outdent(generator);
        (*pFVar9->_vptr_FieldValuePrinter[0xe])
                  (&local_78,pFVar9,message_00,uVar8,(ulong)uVar4,(ulong)this->single_line_mode_);
        TextGenerator::Print
                  (generator,
                   (char *)local_78.
                           super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                   (size_t)local_78.
                           super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
        message = local_50;
        reflection_00 = local_58;
        if (local_78.
            super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&local_78.
                      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_78.
                          super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_78.
                                super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
      }
      else {
        TextGenerator::Print(generator,": ",2);
        PrintFieldValue(this,message,reflection_00,field,(int)uVar8,generator);
        text = "\n";
        if (this->single_line_mode_ != false) {
          text = " ";
        }
        TextGenerator::Print(generator,text,1);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != local_38);
  }
  if (local_88 != (pointer)0x0) {
    operator_delete(local_88,(long)local_80 - (long)local_88);
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintField(const Message& message,
                                     const Reflection* reflection,
                                     const FieldDescriptor* field,
                                     TextGenerator& generator) const {
  if (use_short_repeated_primitives_ &&
      field->is_repeated() &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_STRING &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
    PrintShortRepeatedField(message, reflection, field, generator);
    return;
  }

  int count = 0;

  if (field->is_repeated()) {
    count = reflection->FieldSize(message, field);
  } else if (reflection->HasField(message, field)) {
    count = 1;
  }

  std::vector<const Message*> map_entries;
  const bool is_map = field->is_map();
  if (is_map) {
    map_entries = DynamicMapSorter::Sort(message, count, reflection, field);
  }

  for (int j = 0; j < count; ++j) {
    const int field_index = field->is_repeated() ? j : -1;

    PrintFieldName(message, reflection, field, generator);

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      const FieldValuePrinter* printer = FindWithDefault(
          custom_printers_, field, default_field_value_printer_.get());
      const Message& sub_message =
          field->is_repeated()
              ? (is_map ? *map_entries[j]
                        : reflection->GetRepeatedMessage(message, field, j))
              : reflection->GetMessage(message, field);
      generator.Print(
          printer->PrintMessageStart(
              sub_message, field_index, count, single_line_mode_));
      generator.Indent();
      Print(sub_message, generator);
      generator.Outdent();
      generator.Print(
          printer->PrintMessageEnd(
              sub_message, field_index, count, single_line_mode_));
    } else {
      generator.Print(": ");
      // Write the field value.
      PrintFieldValue(message, reflection, field, field_index, generator);
      if (single_line_mode_) {
        generator.Print(" ");
      } else {
        generator.Print("\n");
      }
    }
  }
}